

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_chatwindow.h
# Opt level: O0

void __thiscall Ui_ChatWindow::setupUi(Ui_ChatWindow *this,QWidget *ChatWindow)

{
  QWidget *pQVar1;
  bool bVar2;
  QGridLayout *pQVar3;
  QPushButton *pQVar4;
  QListView *pQVar5;
  QLineEdit *pQVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QFlags<Qt::AlignmentFlag> local_14c;
  QByteArrayView local_148;
  QString local_138;
  QFlags<Qt::AlignmentFlag> local_11c;
  QByteArrayView local_118;
  QString local_108;
  QFlags<Qt::AlignmentFlag> local_f0;
  QFlags<QAbstractItemView::EditTrigger> local_ec;
  QByteArrayView local_e8;
  QString local_d8;
  QFlags<Qt::AlignmentFlag> local_bc;
  QByteArrayView local_b8;
  QString local_a8;
  QByteArrayView local_90;
  QString local_80;
  QByteArrayView local_68;
  QString local_58;
  QString local_30;
  QWidget *local_18;
  QWidget *ChatWindow_local;
  Ui_ChatWindow *this_local;
  
  local_18 = ChatWindow;
  ChatWindow_local = (QWidget *)this;
  QObject::objectName();
  bVar2 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar1 = local_18;
  if (bVar2) {
    QByteArrayView::QByteArrayView<11ul>(&local_68,(char (*) [11])"ChatWindow");
    QVar7.m_data = (storage_type *)local_68.m_size;
    QVar7.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar7);
    QObject::setObjectName((QString *)pQVar1);
    QString::~QString(&local_58);
  }
  QWidget::resize(local_18,400,300);
  pQVar3 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar3,local_18);
  this->gridLayout = pQVar3;
  pQVar3 = this->gridLayout;
  QByteArrayView::QByteArrayView<11ul>(&local_90,(char (*) [11])"gridLayout");
  QVar8.m_data = (storage_type *)local_90.m_size;
  QVar8.m_size = (qsizetype)&local_80;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar3);
  QString::~QString(&local_80);
  pQVar4 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar4,local_18);
  this->connectButton = pQVar4;
  pQVar4 = this->connectButton;
  QByteArrayView::QByteArrayView<14ul>(&local_b8,(char (*) [14])"connectButton");
  QVar9.m_data = (storage_type *)local_b8.m_size;
  QVar9.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_a8);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar4 = this->connectButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_bc);
  QGridLayout::addWidget(pQVar1,(int)pQVar4,0,0,1,(QFlags_conflict1 *)0x2);
  pQVar5 = (QListView *)operator_new(0x28);
  QListView::QListView(pQVar5,local_18);
  this->chatView = pQVar5;
  pQVar5 = this->chatView;
  QByteArrayView::QByteArrayView<9ul>(&local_e8,(char (*) [9])"chatView");
  QVar10.m_data = (storage_type *)local_e8.m_size;
  QVar10.m_size = (qsizetype)&local_d8;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_d8);
  QWidget::setEnabled(SUB81(this->chatView,0));
  pQVar5 = this->chatView;
  QFlags<QAbstractItemView::EditTrigger>::QFlags(&local_ec,NoEditTriggers);
  QAbstractItemView::setEditTriggers((QFlags_conflict1 *)pQVar5);
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar5 = this->chatView;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_f0);
  QGridLayout::addWidget(pQVar1,(int)pQVar5,1,0,1,(QFlags_conflict1 *)0x2);
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,local_18);
  this->messageEdit = pQVar6;
  pQVar6 = this->messageEdit;
  QByteArrayView::QByteArrayView<12ul>(&local_118,(char (*) [12])"messageEdit");
  QVar11.m_data = (storage_type *)local_118.m_size;
  QVar11.m_size = (qsizetype)&local_108;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_108);
  QWidget::setEnabled(SUB81(this->messageEdit,0));
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar6 = this->messageEdit;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_11c);
  QGridLayout::addWidget(pQVar1,(int)pQVar6,2,0,1,(QFlags_conflict1 *)0x1);
  pQVar4 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar4,local_18);
  this->sendButton = pQVar4;
  pQVar4 = this->sendButton;
  QByteArrayView::QByteArrayView<11ul>(&local_148,(char (*) [11])"sendButton");
  QVar12.m_data = (storage_type *)local_148.m_size;
  QVar12.m_size = (qsizetype)&local_138;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_138);
  QWidget::setEnabled(SUB81(this->sendButton,0));
  pQVar1 = (QWidget *)this->gridLayout;
  pQVar4 = this->sendButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_14c);
  QGridLayout::addWidget(pQVar1,(int)pQVar4,2,1,1,(QFlags_conflict1 *)0x1);
  retranslateUi(this,local_18);
  QPushButton::setDefault(SUB81(this->sendButton,0));
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QWidget *ChatWindow)
    {
        if (ChatWindow->objectName().isEmpty())
            ChatWindow->setObjectName(QString::fromUtf8("ChatWindow"));
        ChatWindow->resize(400, 300);
        gridLayout = new QGridLayout(ChatWindow);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        connectButton = new QPushButton(ChatWindow);
        connectButton->setObjectName(QString::fromUtf8("connectButton"));

        gridLayout->addWidget(connectButton, 0, 0, 1, 2);

        chatView = new QListView(ChatWindow);
        chatView->setObjectName(QString::fromUtf8("chatView"));
        chatView->setEnabled(false);
        chatView->setEditTriggers(QAbstractItemView::NoEditTriggers);

        gridLayout->addWidget(chatView, 1, 0, 1, 2);

        messageEdit = new QLineEdit(ChatWindow);
        messageEdit->setObjectName(QString::fromUtf8("messageEdit"));
        messageEdit->setEnabled(false);

        gridLayout->addWidget(messageEdit, 2, 0, 1, 1);

        sendButton = new QPushButton(ChatWindow);
        sendButton->setObjectName(QString::fromUtf8("sendButton"));
        sendButton->setEnabled(false);

        gridLayout->addWidget(sendButton, 2, 1, 1, 1);


        retranslateUi(ChatWindow);

        sendButton->setDefault(true);


        QMetaObject::connectSlotsByName(ChatWindow);
    }